

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

psa_status_t psa_its_remove(psa_storage_uid_t uid)

{
  int iVar1;
  FILE *__stream;
  FILE *stream;
  char filename [25];
  psa_storage_uid_t uid_local;
  
  unique0x10000080 = uid;
  psa_its_fill_filename(uid,(char *)&stream);
  __stream = fopen((char *)&stream,"rb");
  if (__stream == (FILE *)0x0) {
    uid_local._4_4_ = -0x8c;
  }
  else {
    fclose(__stream);
    iVar1 = remove((char *)&stream);
    if (iVar1 == 0) {
      uid_local._4_4_ = 0;
    }
    else {
      uid_local._4_4_ = -0x92;
    }
  }
  return uid_local._4_4_;
}

Assistant:

psa_status_t psa_its_remove( psa_storage_uid_t uid )
{
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream;
    psa_its_fill_filename( uid, filename );
    stream = fopen( filename, "rb" );
    if( stream == NULL )
        return( PSA_ERROR_DOES_NOT_EXIST );
    fclose( stream );
    if( remove( filename ) != 0 )
        return( PSA_ERROR_STORAGE_FAILURE );
    return( PSA_SUCCESS );
}